

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitPla.c
# Opt level: O2

ABC_UINT64_T Kit_PlaToTruth6(char *pSop,int nVars)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  
  if (6 < nVars) {
    __assert_fail("nVars < 7",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitPla.c"
                  ,0x1c8,"ABC_UINT64_T Kit_PlaToTruth6(char *, int)");
  }
  iVar2 = 0;
  uVar4 = (ulong)(uint)nVars;
  if (nVars < 1) {
    uVar4 = 0;
  }
  uVar3 = 0;
  while( true ) {
    pcVar6 = pSop + iVar2;
    uVar5 = 0xffffffffffffffff;
    for (lVar7 = 0; uVar4 * 8 - lVar7 != 0; lVar7 = lVar7 + 8) {
      cVar1 = *pcVar6;
      if (cVar1 != '-') {
        if (cVar1 == '0') {
          uVar5 = uVar5 & ~*(ulong *)((long)Kit_PlaToTruth6::Truth + lVar7);
        }
        else {
          if (cVar1 != '1') {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitPla.c"
                          ,0x1d2,"ABC_UINT64_T Kit_PlaToTruth6(char *, int)");
          }
          uVar5 = uVar5 & *(ulong *)((long)Kit_PlaToTruth6::Truth + lVar7);
        }
      }
      pcVar6 = pcVar6 + 1;
    }
    lVar7 = (long)(iVar2 + (int)uVar4);
    if (pSop[lVar7] != ' ') {
      __assert_fail("pSop[lit] == \' \'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitPla.c"
                    ,0x1d5,"ABC_UINT64_T Kit_PlaToTruth6(char *, int)");
    }
    if (pSop[lVar7 + 2] != '\n') break;
    uVar3 = uVar3 | uVar5;
    iVar2 = iVar2 + (int)uVar4 + 3;
    if (pSop[iVar2] == '\0') {
      iVar2 = Kit_PlaIsComplement(pSop);
      return uVar3 ^ (long)-iVar2;
    }
  }
  __assert_fail("pSop[lit] == \'\\n\'",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitPla.c"
                ,0x1d8,"ABC_UINT64_T Kit_PlaToTruth6(char *, int)");
}

Assistant:

ABC_UINT64_T Kit_PlaToTruth6( char * pSop, int nVars )
{
    static ABC_UINT64_T Truth[8] = {
        ABC_CONST(0xAAAAAAAAAAAAAAAA),
        ABC_CONST(0xCCCCCCCCCCCCCCCC),
        ABC_CONST(0xF0F0F0F0F0F0F0F0),
        ABC_CONST(0xFF00FF00FF00FF00),
        ABC_CONST(0xFFFF0000FFFF0000),
        ABC_CONST(0xFFFFFFFF00000000),
        ABC_CONST(0x0000000000000000),
        ABC_CONST(0xFFFFFFFFFFFFFFFF)
    };
    ABC_UINT64_T valueAnd, valueOr = Truth[6];
    int v, lit = 0;
    assert( nVars < 7 );
    do {
        valueAnd = Truth[7];
        for ( v = 0; v < nVars; v++, lit++ )
        {
            if ( pSop[lit] == '1' )
                valueAnd &=  Truth[v];
            else if ( pSop[lit] == '0' )
                valueAnd &= ~Truth[v];
            else if ( pSop[lit] != '-' )
                assert( 0 );
        }
        valueOr |= valueAnd;
        assert( pSop[lit] == ' ' );
        lit++;
        lit++;
        assert( pSop[lit] == '\n' );
        lit++;
    } while ( pSop[lit] );
    if ( Kit_PlaIsComplement(pSop) )
        valueOr = ~valueOr;
    return valueOr;
}